

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::ConfigInstanceIdentifierSyntax>
          (DeepCloneVisitor *this,ConfigInstanceIdentifierSyntax *node,BumpAllocator *alloc)

{
  ConfigInstanceIdentifierSyntax *pCVar1;
  Token local_38;
  Token local_28;
  
  local_28 = parsing::Token::deepClone(&node->dot,alloc);
  local_38 = parsing::Token::deepClone(&node->name,alloc);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConfigInstanceIdentifierSyntax,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_28,&local_38);
  return &pCVar1->super_SyntaxNode;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }